

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::anon_unknown_10::LogFileObject::SetBasename(LogFileObject *this,char *basename)

{
  bool bVar1;
  MutexLock local_20;
  MutexLock l;
  char *basename_local;
  LogFileObject *this_local;
  
  l.mu_ = (Mutex *)basename;
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_20,&this->lock_);
  this->base_filename_selected_ = true;
  bVar1 = std::operator!=(&this->base_filename_,(char *)l.mu_);
  if (bVar1) {
    if (this->file_ != (FILE *)0x0) {
      fclose((FILE *)this->file_);
      this->file_ = (FILE *)0x0;
      this->rollover_attempt_ = 0x1f;
    }
    std::__cxx11::string::operator=((string *)&this->base_filename_,(char *)l.mu_);
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void LogFileObject::SetBasename(const char* basename) {
  MutexLock l(&lock_);
  base_filename_selected_ = true;
  if (base_filename_ != basename) {
    // Get rid of old log file since we are changing names
    if (file_ != NULL) {
      fclose(file_);
      file_ = NULL;
      rollover_attempt_ = kRolloverAttemptFrequency-1;
    }
    base_filename_ = basename;
  }
}